

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argumentHandlers.cpp
# Opt level: O0

error_t ArgumentHandlers::eventPomdp_parse_argument(int key,char *arg,argp_state *state)

{
  long lVar1;
  int iVar2;
  long in_RDX;
  char *in_RSI;
  int in_EDI;
  Arguments *theArgumentsStruc;
  
  lVar1 = *(long *)(in_RDX + 0x28);
  if (in_EDI == 0x46) {
    iVar2 = atoi(in_RSI);
    *(int *)(lVar1 + 0x230) = iVar2;
  }
  else {
    if (in_EDI != 0x6d) {
      return 7;
    }
    *(undefined1 *)(lVar1 + 0x222) = 1;
    iVar2 = atoi(in_RSI);
    *(long *)(lVar1 + 0x228) = (long)iVar2;
  }
  return 0;
}

Assistant:

error_t
eventPomdp_parse_argument (int key, char *arg, struct argp_state *state)
{
    /* Get the input argument from argp_parse, which we
      know is a pointer to our arguments structure. */
    struct Arguments *theArgumentsStruc = (struct Arguments*) state->input;

    switch (key)
    {
    case 'm':
        theArgumentsStruc->marginalize = true;
        theArgumentsStruc->marginalizationIndex = atoi(arg);
        break;
    case 'F':
        theArgumentsStruc->falseNegativeObs = atoi(arg);
        break;
    default:
        return ARGP_ERR_UNKNOWN;
    }
    return 0;
}